

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O2

void __thiscall
btSoftRigidDynamicsWorld::addSoftBody
          (btSoftRigidDynamicsWorld *this,btSoftBody *body,short collisionFilterGroup,
          short collisionFilterMask)

{
  btSoftBody *local_28;
  
  local_28 = body;
  btAlignedObjectArray<btSoftBody_*>::push_back(&this->m_softBodies,&local_28);
  local_28->m_softBodySolver = this->m_softBodySolver;
  btCollisionWorld::addCollisionObject
            ((btCollisionWorld *)this,&local_28->super_btCollisionObject,collisionFilterGroup,
             collisionFilterMask);
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::addSoftBody(btSoftBody* body,short int collisionFilterGroup,short int collisionFilterMask)
{
	m_softBodies.push_back(body);

	// Set the soft body solver that will deal with this body
	// to be the world's solver
	body->setSoftBodySolver( m_softBodySolver );

	btCollisionWorld::addCollisionObject(body,
		collisionFilterGroup,
		collisionFilterMask);

}